

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O0

h__Reader * __thiscall
ASDCP::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc
          (h__Reader *this,TimedTextDescriptor *TDesc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  unsigned_long_long *puVar4;
  byte_t *pbVar5;
  UTF16String *pUVar6;
  reference pUVar7;
  long lVar8;
  ILogSink *this_00;
  undefined8 *in_RDX;
  pair<const_Kumu::UUID,_Kumu::UUID> local_188;
  undefined1 local_144 [8];
  TimedTextResourceDescriptor TmpResource;
  InterchangeObject *tmp_iobj;
  __normal_iterator<Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_> local_b0;
  Result_t local_a8 [8];
  Result_t result;
  TimedTextResourceSubDescriptor *DescObject;
  __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
  local_30;
  const_iterator sdi;
  TimedTextDescriptor *TDescObj;
  TimedTextDescriptor *TDesc_local;
  h__Reader *this_local;
  
  if (TDesc[10].ResourceList.
      super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
      ._M_impl._M_node.super__List_node_base._M_prev == (_List_node_base *)0x0) {
    __assert_fail("m_EssenceDescriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_TimedText.cpp"
                  ,0x9b,
                  "ASDCP::Result_t ASDCP::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedText::TimedTextDescriptor &)"
                 );
  }
  memset(TDesc[0xb].AssetID + 8,0,0x10);
  sdi._M_current =
       (UUID *)TDesc[10].ResourceList.
               super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
  *in_RDX = ((_List_node_base *)((long)sdi._M_current + 0xf0))->_M_next;
  bVar1 = MXF::optional_property<unsigned_long_long>::empty
                    ((optional_property<unsigned_long_long> *)
                     &((_List_node_base *)((long)sdi._M_current + 0xf0))->_M_prev);
  if (!bVar1) {
    puVar4 = MXF::optional_property::operator_cast_to_unsigned_long_long_
                       ((optional_property *)(sdi._M_current[7].super_Identifier<16U>.m_Value + 0xf)
                       );
    if (0xffffffff < *puVar4) {
      __assert_fail("TDescObj->ContainerDuration <= 0xFFFFFFFFL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_TimedText.cpp"
                    ,0xa2,
                    "ASDCP::Result_t ASDCP::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedText::TimedTextDescriptor &)"
                   );
    }
    puVar4 = MXF::optional_property::operator_cast_to_unsigned_long_long_
                       ((optional_property *)(sdi._M_current[7].super_Identifier<16U>.m_Value + 0xf)
                       );
    *(int *)(in_RDX + 1) = (int)*puVar4;
  }
  pbVar5 = Kumu::Identifier<16U>::Value
                     ((Identifier<16U> *)(sdi._M_current[0xb].super_Identifier<16U>.m_Value + 7));
  *(undefined8 *)((long)in_RDX + 0xc) = *(undefined8 *)pbVar5;
  *(undefined8 *)((long)in_RDX + 0x14) = *(undefined8 *)(pbVar5 + 8);
  std::__cxx11::string::operator=((string *)(in_RDX + 4),(string *)(sdi._M_current + 0xe));
  std::__cxx11::string::operator=
            ((string *)(in_RDX + 8),
             (string *)(sdi._M_current[0xc].super_Identifier<16U>.m_Value + 0xf));
  pUVar6 = MXF::optional_property::operator_cast_to_UTF16String_
                     ((optional_property *)(sdi._M_current + 0xf));
  std::__cxx11::string::operator=((string *)(in_RDX + 0xf),(string *)&pUVar6->super_string);
  std::__cxx11::
  list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
  ::clear((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
           *)(in_RDX + 0xc));
  DescObject = (TimedTextResourceSubDescriptor *)
               std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::begin
                         ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                          &sdi._M_current[6].super_Identifier<16U>.m_HasValue);
  __gnu_cxx::__normal_iterator<Kumu::UUID_const*,std::vector<Kumu::UUID,std::allocator<Kumu::UUID>>>
  ::__normal_iterator<Kumu::UUID*>
            ((__normal_iterator<Kumu::UUID_const*,std::vector<Kumu::UUID,std::allocator<Kumu::UUID>>>
              *)&local_30,
             (__normal_iterator<Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
              *)&DescObject);
  Kumu::Result_t::Result_t(local_a8,(Result_t *)Kumu::RESULT_OK);
  while( true ) {
    local_b0._M_current =
         (UUID *)std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::end
                           ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                            &sdi._M_current[6].super_Identifier<16U>.m_HasValue);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_b0);
    bVar1 = false;
    if (bVar2) {
      iVar3 = Kumu::Result_t::operator_cast_to_int(local_a8);
      bVar1 = -1 < iVar3;
    }
    if (!bVar1) break;
    pUVar7 = __gnu_cxx::
             __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
             ::operator*(&local_30);
    MXF::OP1aHeader::GetMDObjectByID
              ((OP1aHeader *)(TmpResource.ResourceID + 0xc),(UUID *)(TDesc->AssetID + 0xc),
               (InterchangeObject **)pUVar7);
    Kumu::Result_t::operator=(local_a8,(Result_t *)(TmpResource.ResourceID + 0xc));
    Kumu::Result_t::~Result_t((Result_t *)(TmpResource.ResourceID + 0xc));
    iVar3 = Kumu::Result_t::operator_cast_to_int(local_a8);
    if (iVar3 < 0) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(this_00,"Broken sub-descriptor link\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
LAB_002b4ac1:
      Kumu::Result_t::~Result_t(local_a8);
      return this;
    }
    TimedTextResourceDescriptor::TimedTextResourceDescriptor
              ((TimedTextResourceDescriptor *)local_144);
    pbVar5 = Kumu::Identifier<16U>::Value((Identifier<16U> *)0xa0);
    local_144 = *(undefined1 (*) [8])pbVar5;
    TmpResource.ResourceID._0_8_ = *(undefined8 *)(pbVar5 + 8);
    lVar8 = std::__cxx11::string::find((char *)0xc8,0x2daae4);
    if (((lVar8 == -1) && (lVar8 = std::__cxx11::string::find((char *)0xc8,0x2de36e), lVar8 == -1))
       && (lVar8 = std::__cxx11::string::find((char *)0xc8,0x2de385), lVar8 == -1)) {
      lVar8 = std::__cxx11::string::find((char *)0xc8,0x2daada);
      TmpResource.ResourceID[9] = '\0';
      TmpResource.ResourceID[10] = '\0';
      TmpResource.ResourceID[0xb] = '\0';
      TmpResource.ResourceID[8] = lVar8 != -1;
    }
    else {
      TmpResource.ResourceID[8] = '\x02';
      TmpResource.ResourceID[9] = '\0';
      TmpResource.ResourceID[10] = '\0';
      TmpResource.ResourceID[0xb] = '\0';
    }
    std::__cxx11::
    list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
    ::push_back((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                 *)(in_RDX + 0xc),(value_type *)local_144);
    pUVar7 = __gnu_cxx::
             __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
             ::operator*(&local_30);
    std::pair<const_Kumu::UUID,_Kumu::UUID>::pair<Kumu::UUID_&,_true>
              (&local_188,(UUID *)0xa0,pUVar7);
    std::
    map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
    ::insert((map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
              *)&TDesc[10].ResourceList.
                 super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                 ._M_impl._M_node._M_size,&local_188);
    std::pair<const_Kumu::UUID,_Kumu::UUID>::~pair(&local_188);
    __gnu_cxx::
    __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::
    operator++(&local_30,0);
  }
  Kumu::Result_t::Result_t((Result_t *)this,local_a8);
  goto LAB_002b4ac1;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedText::TimedTextDescriptor& TDesc)
{
  assert(m_EssenceDescriptor);
  memset(&m_TDesc.AssetID, 0, UUIDlen);
  MXF::TimedTextDescriptor* TDescObj = (MXF::TimedTextDescriptor*)m_EssenceDescriptor;

  TDesc.EditRate = TDescObj->SampleRate;
  if ( ! TDescObj->ContainerDuration.empty() )
    {
      assert(TDescObj->ContainerDuration <= 0xFFFFFFFFL);
      TDesc.ContainerDuration = (ui32_t) TDescObj->ContainerDuration;
    }
  memcpy(TDesc.AssetID, TDescObj->ResourceID.Value(), UUIDlen);
  TDesc.NamespaceName = TDescObj->NamespaceURI;
  TDesc.EncodingName = TDescObj->UCSEncoding;
  TDesc.RFC5646LanguageTagList = TDescObj->RFC5646LanguageTagList;
  TDesc.ResourceList.clear();

  Array<UUID>::const_iterator sdi = TDescObj->SubDescriptors.begin();
  TimedTextResourceSubDescriptor* DescObject = 0;
  Result_t result = RESULT_OK;

  for ( ; sdi != TDescObj->SubDescriptors.end() && KM_SUCCESS(result); sdi++ )
    {
      InterchangeObject* tmp_iobj = 0;
      result = m_HeaderPart.GetMDObjectByID(*sdi, &tmp_iobj);
      DescObject = static_cast<TimedTextResourceSubDescriptor*>(tmp_iobj);

      if ( KM_SUCCESS(result) )
	{
	  TimedTextResourceDescriptor TmpResource;
	  memcpy(TmpResource.ResourceID, DescObject->AncillaryResourceID.Value(), UUIDlen);

	  if ( DescObject->MIMEMediaType.find("application/x-font-opentype") != std::string::npos
	       || DescObject->MIMEMediaType.find("application/x-opentype") != std::string::npos
	       || DescObject->MIMEMediaType.find("font/opentype") != std::string::npos )
	    TmpResource.Type = MT_OPENTYPE;

	  else if ( DescObject->MIMEMediaType.find("image/png") != std::string::npos )
	    TmpResource.Type = MT_PNG;

	  else
	    TmpResource.Type = MT_BIN;

	  TDesc.ResourceList.push_back(TmpResource);
	  m_ResourceMap.insert(ResourceMap_t::value_type(DescObject->AncillaryResourceID, *sdi));
	}
      else
	{
	  DefaultLogSink().Error("Broken sub-descriptor link\n");
	  return RESULT_FORMAT;
	}
    }

  return result;
}